

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O2

const_buffer * __thiscall
cppcms::impl::cgi::http::make_chunked_wrapper
          (const_buffer *__return_storage_ptr__,http *this,const_buffer *in,bool completed)

{
  size_t sVar1;
  ostream *poVar2;
  char *p;
  const_buffer cStack_238;
  const_buffer local_208;
  const_buffer local_1d8;
  ostringstream ss;
  uint auStack_190 [88];
  
  sVar1 = booster::aio::buffer_impl<const_char_*>::bytes_count(&in->super_buffer_impl<const_char_*>)
  ;
  if (sVar1 == 0) {
    if (completed) {
      booster::aio::buffer(__return_storage_ptr__,"0\r\n\r\n",5);
    }
    else {
      booster::aio::buffer_impl<const_char_*>::buffer_impl
                (&__return_storage_ptr__->super_buffer_impl<const_char_*>,
                 &in->super_buffer_impl<const_char_*>);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    *(uint *)((long)auStack_190 + *(long *)(_ss + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_ss + -0x18)) & 0xffffffb5 | 8;
    booster::aio::buffer_impl<const_char_*>::bytes_count(&in->super_buffer_impl<const_char_*>);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&ss);
    p = "\r\n";
    std::operator<<(poVar2,"\r\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->chunked_header_,(string *)&cStack_238);
    std::__cxx11::string::~string((string *)&cStack_238);
    if (completed) {
      p = "\r\n0\r\n\r\n";
    }
    booster::aio::buffer(&local_1d8,&this->chunked_header_);
    booster::aio::operator+(&cStack_238,&local_1d8,in);
    booster::aio::buffer(&local_208,p,(ulong)completed * 5 + 2);
    booster::aio::operator+(__return_storage_ptr__,&cStack_238,&local_208);
    std::
    _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::~_Vector_base(&local_208.super_buffer_impl<const_char_*>.vec_.
                     super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                   );
    std::
    _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::~_Vector_base(&cStack_238.super_buffer_impl<const_char_*>.vec_.
                     super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                   );
    std::
    _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::~_Vector_base(&local_1d8.super_buffer_impl<const_char_*>.vec_.
                     super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                   );
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  }
  return __return_storage_ptr__;
}

Assistant:

booster::aio::const_buffer make_chunked_wrapper(booster::aio::const_buffer const &in,bool completed)
		{
			if(in.bytes_count() == 0) {
				if(!completed) 
					return in;
				else 
					return booster::aio::buffer("0\r\n\r\n",5);
			}

			std::ostringstream ss;
			ss << std::hex << in.bytes_count() << "\r\n";
			chunked_header_ = std::move(ss.str());
			char const *trailer = "\r\n";
			int trailer_len = 2;
			if(completed) {
				trailer = "\r\n0\r\n\r\n";
				trailer_len = 7;
			}
			return booster::aio::buffer(chunked_header_) + in + booster::aio::buffer(trailer,trailer_len);
		}